

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.cc
# Opt level: O2

void __thiscall
message_test_should_overwrite_tags_in_message_Test::TestBody
          (message_test_should_overwrite_tags_in_message_Test *this)

{
  Type *lhs;
  Type *lhs_00;
  char *pcVar1;
  undefined1 local_f30 [8];
  MyMessage message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertionResult gtest_ar_1;
  
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_f30,"MyMessageTags","LogonTags + 1",&TestBody::MyMessageTags,
             (unsigned_long *)&local_28);
  if (local_f30[0] == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (message.
        super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
        .
        super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
        .values.base.
        super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_false>.value.
        val_._M_dataplus._M_p == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)message.
                         super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .
                         super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .values.base.
                         super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_false>
                         .value.val_._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
               ,0xb8,pcVar1);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_1.message_,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&message);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&message);
    Fixpp::
    MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
    ::MessageBase((MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                   *)local_f30);
    Fixpp::
    set<Fixpp::TagT<108u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>,char_const(&)[4]>
              ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                *)local_f30,(char (*) [4])"30s");
    lhs = Fixpp::
          get<Fixpp::TagT<108u,Fixpp::Type::String>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>>
                    ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                      *)local_f30);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)&local_28,"Fixpp::get<HeartBtStr>(message)","\"30s\"",lhs,
               (char (*) [4])"30s");
    if (local_28.ptr_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar_1.message_);
      if (gtest_ar_1._0_8_ == 0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = *(char **)gtest_ar_1._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 ((long)(message.
                         super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .
                         super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .unparsed.Storage.InlineElts + 8) + 0x10),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                 ,0xbd,pcVar1);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 ((long)(message.
                         super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .
                         super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .unparsed.Storage.InlineElts + 8) + 0x10),(Message *)&gtest_ar_1.message_);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 ((long)(message.
                         super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .
                         super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                         .unparsed.Storage.InlineElts + 8) + 0x10));
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1.message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
      local_28.ptr_._0_4_ = 0x4bc;
      Fixpp::
      set<Fixpp::TagT<2154u,Fixpp::Type::Int>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>,int>
                ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                  *)local_f30,(int *)&local_28);
      lhs_00 = Fixpp::
               get<Fixpp::TagT<2154u,Fixpp::Type::Int>,Fixpp::VersionnedMessage<Fixpp::v42::Version,Fixpp::Chars<(char)65>,Fixpp::Required<Fixpp::TagT<98u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<108u,Fixpp::Type::String>>,Fixpp::TagT<95u,Fixpp::Type::String>,Fixpp::TagT<96u,Fixpp::Type::String>,Fixpp::TagT<141u,Fixpp::Type::String>,Fixpp::TagT<383u,Fixpp::Type::String>,Fixpp::SmallRepeatingGroup<Fixpp::TagT<384u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<372u,Fixpp::Type::String>,Fixpp::TagT<385u,Fixpp::Type::Char>>,Fixpp::TagT<2154u,Fixpp::Type::Int>>>
                         ((VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           *)local_f30);
      gtest_ar_1.message_.ptr_._0_4_ = 0x4bc;
      testing::internal::CmpHelperEQ<long,int>
                ((internal *)&local_28,"Fixpp::get<MyTag>(message)","1212",lhs_00,
                 (int *)&gtest_ar_1.message_);
      if (local_28.ptr_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&gtest_ar_1.message_);
        if (gtest_ar_1._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar_1._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   ((long)(message.
                           super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           .
                           super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           .unparsed.Storage.InlineElts + 8) + 0x10),kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/message_test.cc"
                   ,0xc0,pcVar1);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   ((long)(message.
                           super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           .
                           super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           .unparsed.Storage.InlineElts + 8) + 0x10),(Message *)&gtest_ar_1.message_
                  );
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   ((long)(message.
                           super_MessageT<Fixpp::Chars<_A_>,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           .
                           super_MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                           .unparsed.Storage.InlineElts + 8) + 0x10));
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_1.message_);
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_1);
    Fixpp::
    MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
    ::~MessageBase((MessageBase<Fixpp::Field,_Fixpp::Required<Fixpp::TagT<98U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<108U,_Fixpp::Type::String>_>,_Fixpp::TagT<95U,_Fixpp::Type::String>,_Fixpp::TagT<96U,_Fixpp::Type::String>,_Fixpp::TagT<141U,_Fixpp::Type::String>,_Fixpp::TagT<383U,_Fixpp::Type::String>,_Fixpp::SmallRepeatingGroup<Fixpp::TagT<384U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<372U,_Fixpp::Type::String>,_Fixpp::TagT<385U,_Fixpp::Type::Char>_>,_Fixpp::TagT<2154U,_Fixpp::Type::Int>_>
                    *)local_f30);
  }
  return;
}

Assistant:

TEST(message_test, should_overwrite_tags_in_message)
{
    using namespace Fixpp;
    using MyTag = Fixpp::TagT<2154, Fixpp::Type::Int>;

    struct LogonOverwrite : public Fixpp::MessageOverwrite<Fixpp::v42::Message::Logon>
    {
        using OverwriteHeartBtInt = ChangeType<Of<Tag::HeartBtInt>, To<Type::String>>;
        using HeartBtStr = typename OverwriteHeartBtInt::Type;

        using Changes = ChangeSet<
           OverwriteHeartBtInt,
           AddTag<MyTag>
      >;
    };

    using MyMessage = LogonOverwrite::Changes::Apply;
    using HeartBtStr = LogonOverwrite::HeartBtStr;

    static constexpr size_t LogonTags = Fixpp::v42::Message::Logon::TotalTags;
    static constexpr size_t MyMessageTags = MyMessage::TotalTags;

    // MyMessage should have one more tag
    ASSERT_EQ(MyMessageTags, LogonTags + 1);

    MyMessage message;

    Fixpp::set<HeartBtStr>(message, "30s");
    ASSERT_EQ(Fixpp::get<HeartBtStr>(message), "30s");

    Fixpp::set<MyTag>(message, 1212);
    ASSERT_EQ(Fixpp::get<MyTag>(message), 1212);
}